

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_14dc25::DecompressZip
               (uchar *dst,unsigned_long *uncompressedSize,uchar *src,unsigned_long srcSize)

{
  long lVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  reference pvVar4;
  value_type *pvVar5;
  long *in_RSI;
  value_type *in_RDI;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  size_type in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  value_type *local_80;
  reference local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uchar *in_stack_ffffffffffffffb8;
  mz_ulong *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x28ba99);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff60,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
             ,in_stack_ffffffffffffff50);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x28babf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar2 = mz_uncompress(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8,
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar2 != 0) {
    __assert_fail("ret == miniz::MZ_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1bd2,
                  "void (anonymous namespace)::DecompressZip(unsigned char *, unsigned long &, const unsigned char *, unsigned long)"
                 );
  }
  pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this = pvVar3;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  lVar1 = *in_RSI;
  while (local_58 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)&(pvVar3->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1),
        local_58 < (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pvVar4 + lVar1)) {
    *(value_type *)
     &(local_58->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start =
         *(value_type *)
          &(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start +
         *(value_type *)
          &(local_58->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 0x80;
    pvVar3 = local_58;
  }
  local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (local_70,in_stack_ffffffffffffff38);
  lVar1 = *in_RSI;
  local_80 = in_RDI;
  local_78 = pvVar4 + (*in_RSI + 1U >> 1);
  while (local_80 < in_RDI + lVar1) {
    pvVar5 = local_80 + 1;
    *local_80 = *(value_type *)
                 &(local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (in_RDI + lVar1 <= pvVar5) break;
    local_80 = local_80 + 2;
    *pvVar5 = *local_78;
    local_78 = local_78 + 1;
    local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

void DecompressZip(unsigned char *dst, unsigned long &uncompressedSize,
                   const unsigned char *src, unsigned long srcSize) {
  std::vector<unsigned char> tmpBuf(uncompressedSize);

  int ret =
      miniz::mz_uncompress(&tmpBuf.at(0), &uncompressedSize, src, srcSize);
  assert(ret == miniz::MZ_OK);
  (void)ret;

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressedSize;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = d;
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressedSize + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressedSize;

    while (true) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }
}